

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2_impl.h
# Opt level: O0

void store32(void *dst,uint32_t w)

{
  uint8_t *p;
  uint32_t w_local;
  void *dst_local;
  
  *(char *)dst = (char)w;
  *(char *)((long)dst + 1) = (char)(w >> 8);
  *(char *)((long)dst + 2) = (char)(w >> 0x10);
  *(char *)((long)dst + 3) = (char)(w >> 0x18);
  return;
}

Assistant:

static BLAKE2_INLINE void store32( void *dst, uint32_t w )
{
#if defined(NATIVE_LITTLE_ENDIAN)
  memcpy(dst, &w, sizeof w);
#else
  uint8_t *p = ( uint8_t * )dst;
  p[0] = (uint8_t)(w >>  0);
  p[1] = (uint8_t)(w >>  8);
  p[2] = (uint8_t)(w >> 16);
  p[3] = (uint8_t)(w >> 24);
#endif
}